

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void libtorrent::dht::anon_unknown_0::put_data_cb
               (item *i,bool auth,shared_ptr<libtorrent::dht::put_data> *ta,
               function<void_(libtorrent::dht::item_&)> *f)

{
  element_type *this;
  undefined1 local_e0 [8];
  item copy;
  function<void_(libtorrent::dht::item_&)> *f_local;
  shared_ptr<libtorrent::dht::put_data> *ta_local;
  bool auth_local;
  item *i_local;
  
  if (auth) {
    copy._176_8_ = f;
    item::item((item *)local_e0,i);
    ::std::function<void_(libtorrent::dht::item_&)>::operator()
              ((function<void_(libtorrent::dht::item_&)> *)copy._176_8_,(item *)local_e0);
    this = ::std::
           __shared_ptr_access<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ta);
    put_data::set_data(this,(item *)local_e0);
    item::~item((item *)local_e0);
  }
  return;
}

Assistant:

void put_data_cb(item const& i, bool auth
	, std::shared_ptr<put_data> const& ta
	, std::function<void(item&)> const& f)
{
	// call data_callback only when we got authoritative data.
	if (auth)
	{
		item copy(i);
		f(copy);
		ta->set_data(std::move(copy));
	}
}